

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  Cluster **ppCVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  longlong lVar6;
  longlong lVar7;
  ulong uVar8;
  Cues *this_00;
  Cluster *pCVar9;
  long lVar10;
  Cluster **ppCVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  Cluster **ppCVar15;
  longlong avail;
  long local_58;
  Cluster **local_50;
  longlong total;
  long len_;
  longlong pos_;
  
  iVar5 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&total,&avail);
  if (iVar5 < 0) {
    return (long)iVar5;
  }
  lVar12 = this->m_start + this->m_size;
  if (this->m_size < 0) {
    lVar12 = -1;
  }
  lVar6 = *pos;
  local_50 = pResult;
LAB_0015c573:
  do {
    if ((-1 < total && total <= lVar6) || (-1 < lVar12 && lVar12 <= lVar6)) {
      return 1;
    }
    if (avail <= lVar6) {
      *len = 1;
      return -3;
    }
    lVar6 = GetUIntLength(this->m_pReader,lVar6,len);
    if (lVar6 < 0) {
      return lVar6;
    }
    if (lVar6 != 0) {
      return -3;
    }
    local_58 = *pos;
    if (-1 < lVar12 && lVar12 < *len + local_58) {
      return -2;
    }
    if (avail < *len + local_58) {
      return -3;
    }
    lVar13 = this->m_start;
    lVar7 = ReadID(this->m_pReader,local_58,len);
    if (lVar7 < 0) {
      return lVar7;
    }
    if (lVar7 == 0) {
      return -1;
    }
    lVar10 = *pos + *len;
    *pos = lVar10;
    if (avail <= lVar10) {
      *len = 1;
      return -3;
    }
    lVar6 = GetUIntLength(this->m_pReader,lVar10,len);
    if (lVar6 < 0) {
      return lVar6;
    }
    if (lVar6 != 0) {
      return -3;
    }
    lVar10 = *len + *pos;
    if (-1 < lVar12 && lVar12 < lVar10) {
      return -2;
    }
    if (avail < lVar10) {
      return -3;
    }
    uVar8 = ReadUInt(this->m_pReader,*pos,len);
    if ((long)uVar8 < 0) {
      return uVar8;
    }
    lVar10 = *len;
    lVar6 = *pos + lVar10;
    *pos = lVar6;
  } while (uVar8 == 0);
  uVar14 = -1L << ((char)lVar10 * '\a' & 0x3fU) ^ uVar8;
  lVar10 = uVar8 + lVar6;
  if (((-1 < lVar12) && (uVar14 != 0xffffffffffffffff)) && (lVar12 < lVar10)) {
    return -2;
  }
  if (lVar7 == 0x1c53bb6b) {
    if (uVar14 == 0xffffffffffffffff) {
      return -2;
    }
    if (-1 < lVar12 && lVar12 < lVar10) {
      return -2;
    }
    if (this->m_pCues == (Cues *)0x0) {
      this_00 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
      if (this_00 == (Cues *)0x0) {
        this->m_pCues = (Cues *)0x0;
        return 0;
      }
      Cues::Cues(this_00,this,lVar6,uVar8,local_58,lVar10 - local_58);
      this->m_pCues = this_00;
      lVar10 = *pos + uVar8;
    }
    *pos = lVar10;
    lVar6 = lVar10;
  }
  else {
    if (lVar7 == 0x1f43b675) {
      local_58 = local_58 - lVar13;
      ppCVar15 = this->m_clusters + this->m_clusterCount;
      ppCVar11 = ppCVar15 + this->m_clusterPreloadCount;
      while (ppCVar15 < ppCVar11) {
        auVar3._8_8_ = (long)ppCVar11 - (long)ppCVar15 >> 0x3f;
        auVar3._0_8_ = (long)ppCVar11 - (long)ppCVar15 >> 3;
        ppCVar1 = ppCVar15 + SUB168(auVar3 / SEXT816(2),0);
        pCVar9 = *ppCVar1;
        lVar13 = pCVar9->m_element_start - pCVar9->m_pSegment->m_start;
        *pos = lVar13;
        if (lVar13 < local_58) {
          ppCVar15 = ppCVar1 + 1;
        }
        else {
          ppCVar11 = ppCVar1;
          if (lVar13 <= local_58) {
            *local_50 = pCVar9;
            return 0;
          }
        }
      }
      lVar13 = Cluster::HasBlockEntries(this,local_58,&pos_,&len_);
      if (lVar13 < 0) {
        *pos = pos_;
        *len = len_;
        return lVar13;
      }
      if (lVar13 != 0) {
        pCVar9 = Cluster::Create(this,-1,local_58);
        if (pCVar9 == (Cluster *)0x0) {
          return -1;
        }
        bVar4 = PreloadCluster(this,pCVar9,(long)ppCVar15 - (long)this->m_clusters >> 3);
        if (bVar4) {
          *local_50 = pCVar9;
          return 0;
        }
        Cluster::~Cluster(pCVar9);
        operator_delete(pCVar9);
        return -1;
      }
      lVar13 = *pos;
      lVar10 = lVar13;
      if (uVar14 == 0xffffffffffffffff) {
        while ((lVar10 < total || total < 0 && (lVar10 < lVar12 || lVar12 < 0))) {
          if (avail <= lVar10) {
            *len = 1;
            return -3;
          }
          lVar6 = GetUIntLength(this->m_pReader,lVar10,len);
          if (lVar6 < 0) {
            return lVar6;
          }
          if (lVar6 != 0) {
            return -3;
          }
          lVar10 = *len + *pos;
          if (-1 < lVar12 && lVar12 < lVar10) {
            return -2;
          }
          if (avail < lVar10) {
            return -3;
          }
          lVar6 = ReadID(this->m_pReader,*pos,len);
          if (lVar6 < 0) {
            return lVar6;
          }
          if ((lVar6 == 0x1c53bb6b) || (lVar6 == 0x1f43b675)) break;
          lVar10 = *pos + *len;
          *pos = lVar10;
          if (avail <= lVar10) {
            *len = 1;
            return -3;
          }
          lVar6 = GetUIntLength(this->m_pReader,lVar10,len);
          if (lVar6 < 0) {
            return lVar6;
          }
          if (lVar6 != 0) {
            return -3;
          }
          lVar10 = *len + *pos;
          if (-1 < lVar12 && lVar12 < lVar10) {
            return -2;
          }
          if (avail < lVar10) {
            return -3;
          }
          uVar8 = ReadUInt(this->m_pReader,*pos,len);
          if ((long)uVar8 < 0) {
            return uVar8;
          }
          lVar2 = *len;
          lVar10 = *pos + lVar2;
          *pos = lVar10;
          if (uVar8 != 0) {
            if ((-1L << ((char)lVar2 * '\a' & 0x3fU) ^ uVar8) == 0xffffffffffffffff) {
              return -2;
            }
            lVar10 = lVar10 + uVar8;
            if ((-1 < lVar12) && (lVar12 < lVar10)) {
              return -2;
            }
            *pos = lVar10;
          }
        }
        uVar8 = *pos - lVar13;
        *pos = lVar13;
      }
      *pos = lVar13 + uVar8;
      return (ulong)((long)(lVar13 + uVar8) <= lVar12 || lVar12 < 0) * 4 + -2;
    }
    if (uVar14 == 0xffffffffffffffff) {
      return -2;
    }
    *pos = lVar10;
    lVar6 = lVar10;
  }
  if ((-1 < lVar12) && (lVar12 < lVar6)) {
    return -2;
  }
  goto LAB_0015c573;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}